

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_cf_string_gmatch_aux(lua_State *L)

{
  ulong uVar1;
  int iVar2;
  char *e;
  ulong uVar3;
  char *s;
  ulong uVar4;
  MatchState ms;
  MatchState local_248;
  
  uVar4 = L->base[-2].u64 & 0x7fffffffffff;
  uVar1 = *(ulong *)(uVar4 + 0x38);
  uVar3 = *(ulong *)(uVar4 + 0x30) & 0x7fffffffffff;
  s = (char *)(uVar3 + *(uint *)(uVar4 + 0x40) + 0x18);
  local_248.src_end = (char *)(*(uint *)(uVar3 + 0x14) + uVar3 + 0x18);
  local_248.src_init = (char *)(uVar3 + 0x18);
  local_248.L = L;
  while( true ) {
    if (local_248.src_end < s) {
      return 0;
    }
    local_248.level = 0;
    local_248.depth = 0;
    e = match(&local_248,s,(char *)((uVar1 & 0x7fffffffffff) + 0x18));
    if (e != (char *)0x0) break;
    s = s + 1;
  }
  *(uint *)(uVar4 + 0x40) = (uint)(s == e) + ((int)e - (int)(char *)(uVar3 + 0x18));
  iVar2 = push_captures(&local_248,s,e);
  return iVar2;
}

Assistant:

LJLIB_NOREG LJLIB_CF(string_gmatch_aux)
{
  const char *p = strVdata(lj_lib_upvalue(L, 2));
  GCstr *str = strV(lj_lib_upvalue(L, 1));
  const char *s = strdata(str);
  TValue *tvpos = lj_lib_upvalue(L, 3);
  const char *src = s + tvpos->u32.lo;
  MatchState ms;
  ms.L = L;
  ms.src_init = s;
  ms.src_end = s + str->len;
  for (; src <= ms.src_end; src++) {
    const char *e;
    ms.level = ms.depth = 0;
    if ((e = match(&ms, src, p)) != NULL) {
      int32_t pos = (int32_t)(e - s);
      if (e == src) pos++;  /* Ensure progress for empty match. */
      tvpos->u32.lo = (uint32_t)pos;
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}